

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseNode.h
# Opt level: O0

JITJavascriptString * __thiscall CaseNode::GetUpperBoundStrConst(CaseNode *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *this_00;
  StackSym *this_01;
  JITJavascriptString *pJVar4;
  CaseNode *this_local;
  
  bVar2 = IsUpperBoundStrConst(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CaseNode.h"
                       ,0x3a,"(IsUpperBoundStrConst())",
                       "Upper bound operand is not a string constant");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = GetUpperBound(this);
  this_01 = IR::Opnd::GetStackSym(this_00);
  pJVar4 = (JITJavascriptString *)StackSym::GetConstAddress(this_01,false);
  return pJVar4;
}

Assistant:

JITJavascriptString* GetUpperBoundStrConst()
    {
        AssertMsg(IsUpperBoundStrConst(), "Upper bound operand is not a string constant");
        return static_cast<JITJavascriptString*>(GetUpperBound()->GetStackSym()->GetConstAddress(false));
    }